

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subtypes.h
# Opt level: O0

vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> * __thiscall
wasm::SubTypes::getStrictSubTypes
          (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *__return_storage_ptr__,
          SubTypes *this,HeapType type)

{
  HeapType type_00;
  bool bVar1;
  reference pvVar2;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *this_00;
  reference pHVar3;
  value_type local_80;
  HeapType sub;
  const_iterator __end3;
  const_iterator __begin3;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *__range3;
  value_type curr;
  undefined1 local_40 [8];
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> work;
  SubTypes *this_local;
  HeapType type_local;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *ret;
  
  work.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  this_local = (SubTypes *)type.id;
  type_local.id = (uintptr_t)__return_storage_ptr__;
  std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector(__return_storage_ptr__);
  std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector
            ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_40);
  std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::push_back
            ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_40,
             (value_type *)&this_local);
  while (bVar1 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::empty
                           ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_40),
        ((bVar1 ^ 0xffU) & 1) != 0) {
    pvVar2 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::back
                       ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_40);
    type_00.id = pvVar2->id;
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::pop_back
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_40);
    this_00 = getImmediateSubTypes(this,type_00);
    __end3 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::begin(this_00);
    sub.id = (uintptr_t)std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::end(this_00);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
                                       *)&sub), bVar1) {
      pHVar3 = __gnu_cxx::
               __normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
               ::operator*(&__end3);
      local_80.id = pHVar3->id;
      std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::push_back
                (__return_storage_ptr__,&local_80);
      std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::push_back
                ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_40,&local_80);
      __gnu_cxx::
      __normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
      ::operator++(&__end3);
    }
  }
  work.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
  std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~vector
            ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_40);
  if ((work.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~vector(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<HeapType> getStrictSubTypes(HeapType type) {
    std::vector<HeapType> ret, work;
    work.push_back(type);
    while (!work.empty()) {
      auto curr = work.back();
      work.pop_back();
      for (auto sub : getImmediateSubTypes(curr)) {
        ret.push_back(sub);
        work.push_back(sub);
      }
    }
    return ret;
  }